

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

HelicsApp helicsCreateApp(char *appName,char *appType,char *configFile,HelicsFederateInfo fedInfo,
                         HelicsError *err)

{
  string_view configString;
  bool bVar1;
  pointer pAVar2;
  FederateInfo *pFVar3;
  MasterObjectHolder *this;
  element_type *peVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  HelicsError *in_R8;
  void *retapp;
  FederateInfo *info;
  FederateInfo newFedInfo;
  bool loadFile;
  string_view appTypeName;
  string_view nstring;
  __single_object app;
  string cstring;
  shared_ptr<helics::apps::App> *in_stack_fffffffffffffce8;
  FederateInfo *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  ConfigType in_stack_fffffffffffffd04;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  App *in_stack_fffffffffffffd30;
  pointer in_stack_fffffffffffffd38;
  _Alloc_hider in_stack_fffffffffffffd78;
  _Alloc_hider in_stack_fffffffffffffe78;
  string_view in_stack_fffffffffffffe80;
  string_view in_stack_fffffffffffffe90;
  byte local_99;
  allocator<char> local_51 [33];
  HelicsError *local_30;
  long local_28;
  long local_18;
  long local_10;
  MasterObjectHolder *local_8;
  
  if ((in_R8 != (HelicsError *)0x0) && (in_R8->error_code != 0)) {
    return (HelicsApp)0x0;
  }
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDX == 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::allocator<char>::~allocator(local_51);
  }
  std::make_unique<helics::AppObject>();
  pAVar2 = std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
                     ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                      0x1f5bfd);
  pAVar2->valid = 0x7a8f1c4d;
  if (local_10 == 0) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8);
  }
  if (local_18 == 0) {
    assignError(local_30,-4,
                "app type must be one of \'connector\', \'source\',\'recorder\',\'player\',\'echo\',\'clone\',\'probe\',\'tracer\'"
               );
    local_8 = (MasterObjectHolder *)0x0;
    goto LAB_001f604f;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),in_stack_fffffffffffffcf8
            );
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f5d0e);
  local_99 = (bVar1 ^ 0xffU) & 1;
  if (local_28 == 0) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
    configString._M_str = (char *)in_stack_fffffffffffffd38;
    configString._M_len = (size_t)in_stack_fffffffffffffd30;
    in_stack_fffffffffffffd04 = helics::fileops::getConfigType(configString);
    if (in_stack_fffffffffffffd04 == NONE) goto LAB_001f5e49;
    helics::loadFederateInfo((string *)in_stack_fffffffffffffd78._M_p);
    anon_unknown.dwarf_d56f0::buildApp
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe80,
               (FederateInfo *)in_stack_fffffffffffffe78._M_p);
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
              ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)0x1f5de8);
    std::shared_ptr<helics::apps::App>::operator=
              ((shared_ptr<helics::apps::App> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8)
    ;
    std::shared_ptr<helics::apps::App>::~shared_ptr((shared_ptr<helics::apps::App> *)0x1f5e09);
    local_99 = 0;
    helics::FederateInfo::~FederateInfo(in_stack_fffffffffffffcf0);
  }
  else {
LAB_001f5e49:
    pFVar3 = getFedInfo(in_stack_fffffffffffffcf8,(HelicsError *)in_stack_fffffffffffffcf0);
    if (pFVar3 == (FederateInfo *)0x0) {
      local_8 = (MasterObjectHolder *)0x0;
      goto LAB_001f604f;
    }
    anon_unknown.dwarf_d56f0::buildApp
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe80,
               (FederateInfo *)in_stack_fffffffffffffe78._M_p);
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
              ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)0x1f5ee8);
    std::shared_ptr<helics::apps::App>::operator=
              ((shared_ptr<helics::apps::App> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8)
    ;
    std::shared_ptr<helics::apps::App>::~shared_ptr((shared_ptr<helics::apps::App> *)0x1f5f03);
  }
  pAVar2 = std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
                     ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                      0x1f5f10);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pAVar2->app);
  if (bVar1) {
    if ((local_99 != 0) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f5f6e)
       , !bVar1)) {
      std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::operator->
                ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)0x1f5f7f)
      ;
      std::__shared_ptr_access<helics::apps::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::apps::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1f5f8b);
      helics::apps::App::loadFile
                (in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28,
                 (bool)in_stack_fffffffffffffd27);
    }
    this = (MasterObjectHolder *)
           std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::get
                     ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                      in_stack_fffffffffffffcf0);
    getMasterHolder();
    peVar4 = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f5fcc);
    in_stack_fffffffffffffcf0 = (FederateInfo *)&stack0xfffffffffffffd18;
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::unique_ptr
              ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
               in_stack_fffffffffffffcf0,
               (unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)peVar4);
    MasterObjectHolder::addApp
              (this,(unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
                    in_stack_fffffffffffffd28);
    std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::~unique_ptr
              ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1f600b);
    local_8 = this;
  }
  else {
    assignError(local_30,-4,
                "app type must be one of \'connector\', \'source\',\'recorder\',\'player\',\'echo\',\'clone\',\'probe\',\'tracer\'"
               );
    local_8 = (MasterObjectHolder *)0x0;
  }
LAB_001f604f:
  std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>::~unique_ptr
            ((unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  return local_8;
}

Assistant:

HelicsApp helicsCreateApp(const char* appName, const char* appType, const char* configFile, HelicsFederateInfo fedInfo, HelicsError* err)
{
    static constexpr const char* invalidAppTypeString =
        "app type must be one of 'connector', 'source','recorder','player','echo','clone','probe','tracer'";
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    try {
        auto cstring = AS_STRING(configFile);
        auto app = std::make_unique<helics::AppObject>();
        app->valid = helics::appValidationIdentifier;
        auto nstring = AS_STRING_VIEW(appName);
        if (appType == nullptr) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }

        const std::string_view appTypeName(appType);
        bool loadFile = !cstring.empty();
        if (fedInfo == nullptr && helics::fileops::getConfigType(cstring) != helics::fileops::ConfigType::NONE) {
            helics::FederateInfo newFedInfo = helics::loadFederateInfo(cstring);
            app->app = buildApp(appTypeName, nstring, newFedInfo);
            loadFile = false;
        } else {
            auto* info = getFedInfo(fedInfo, err);
            if (info == nullptr) {
                return nullptr;
            }
            app->app = buildApp(appTypeName, nstring, *info);
        }

        if (!app->app) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAppTypeString);
            return nullptr;
        }
        if (loadFile && !cstring.empty()) {
            app->app->loadFile(cstring);
        }
        auto* retapp = reinterpret_cast<HelicsApp>(app.get());
        getMasterHolder()->addApp(std::move(app));
        return retapp;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}